

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

int dohide(void)

{
  bool bVar1;
  int local_c;
  boolean ismimic;
  
  bVar1 = (youmonst.data)->mlet == '\r';
  if ((((byte)u._1052_1_ >> 2 & 1) != 0) || ((bVar1 && (youmonst.m_ap_type != '\0')))) {
    pline("You are already hiding.");
    local_c = 0;
  }
  else {
    if (bVar1) {
      youmonst.m_ap_type = '\x02';
      youmonst.mappearance = 0;
    }
    else {
      u._1052_1_ = u._1052_1_ & 0xfb | 4;
    }
    newsym((int)u.ux,(int)u.uy);
    local_c = 1;
  }
  return local_c;
}

Assistant:

int dohide(void)
{
	boolean ismimic = youmonst.data->mlet == S_MIMIC;

	if (u.uundetected || (ismimic && youmonst.m_ap_type != M_AP_NOTHING)) {
		pline("You are already hiding.");
		return 0;
	}
	if (ismimic) {
		/* should bring up a dialog "what would you like to imitate?" */
		youmonst.m_ap_type = M_AP_OBJECT;
		youmonst.mappearance = STRANGE_OBJECT;
	} else
		u.uundetected = 1;
	newsym(u.ux,u.uy);
	return 1;
}